

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::getExnrefLocal
          (ExnrefLocalAssigner *this,Name rethrowTarget)

{
  __node_base_ptr p_Var1;
  ulong uVar2;
  ulong uVar3;
  undefined1 local_20 [8];
  Name rethrowTarget_local;
  
  rethrowTarget_local.super_IString.str._M_len = rethrowTarget.super_IString.str._M_str;
  local_20 = rethrowTarget.super_IString.str._M_len;
  uVar3 = 0;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->rethrowTargetToExnrefLocal)._M_h,
                      rethrowTarget_local.super_IString.str._M_len %
                      (this->rethrowTargetToExnrefLocal)._M_h._M_bucket_count,(key_type *)local_20,
                      rethrowTarget_local.super_IString.str._M_len);
  uVar2 = 0;
  if (p_Var1 != (__node_base_ptr)0x0) {
    if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = (ulong)*(uint *)&p_Var1->_M_nxt[3]._M_nxt;
      uVar2 = 0x100000000;
    }
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar3 | uVar2);
}

Assistant:

std::optional<Index> getExnrefLocal(Name rethrowTarget) const {
      auto it = rethrowTargetToExnrefLocal.find(rethrowTarget);
      if (it == rethrowTargetToExnrefLocal.end()) {
        return {};
      } else {
        return it->second;
      }
    }